

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# th.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint64_t uVar3;
  void *pvVar4;
  pthread_t __th;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  cpu_set_t local_b0;
  
  while (iVar1 = getopt(argc,argv,"a:"), iVar1 == 0x61) {
    only_hm = atoi(_optarg);
  }
  if (iVar1 != -1) {
    exit(1);
  }
  if (_optind < argc) {
    fprintf(_stderr,"%s: unknown arg \'%s\'\n",*argv,argv[_optind]);
    uVar2 = 1;
  }
  else {
    randomize(0);
    for (lVar7 = 0; lVar7 != 8000; lVar7 = lVar7 + 8) {
      uVar3 = rnd64();
      *(uint64_t *)((long)the1000 + lVar7) = uVar3;
    }
    for (lVar7 = 0; lVar7 != 8000; lVar7 = lVar7 + 8) {
      pvVar4 = malloc((ulong)*(ushort *)((long)the1000 + lVar7) + 1);
      *(void **)((long)the1000p + lVar7) = pvVar4;
    }
    __th = pthread_self();
    iVar1 = pthread_getaffinity_np(__th,0x80,&local_b0);
    if (iVar1 == 0) {
      iVar1 = __sched_cpucount(0x80,&local_b0);
      uVar6 = (long)iVar1;
    }
    else {
      uVar5 = sysconf(0x53);
      uVar6 = 0;
      if (0 < (long)uVar5) {
        uVar6 = uVar5;
      }
    }
    nthreads = 8;
    if (uVar6 != 0) {
      nthreads = uVar6;
    }
    nwthreads = nthreads >> 1;
    if (nthreads < 2) {
      nwthreads = 1;
    }
    nrthreads = nthreads - nwthreads;
    if (nthreads - nwthreads == 0) {
      nrthreads = 1;
    }
    printf("Using %zu threads; %zu readers %zu writers in mixed tests.\n");
    test("read 1-of-1",1,0,thread_read1,(thread_func_t)0x0,0);
    test("read 1-of-2",2,0,thread_read1,(thread_func_t)0x0,0);
    test("read 1-of-1000",1,1000,thread_read1,(thread_func_t)0x0,0);
    test("read 1000-of-1000",0,1000,thread_read1000,(thread_func_t)0x0,0);
    test("read 1-of-1000 pointers",0,-1000,thread_read1p,(thread_func_t)0x0,0);
    test("read 1 write 1000",1,0,thread_read1,thread_write1000,0);
    test("read 1000 write 1000",0,1000,thread_read1000,thread_write1000,0);
    test("read-write-remove",0,0,thread_read_write_remove,(thread_func_t)0xffffffffffffffff,0);
    test("read 1-of-1 cachekiller",1,0,thread_read1_cachekiller,(thread_func_t)0x0,0);
    test("read 1-of-1000 cachekiller",1,1000,thread_read1_cachekiller,(thread_func_t)0x0,0);
    test("read 1000 write 1000 cachekiller",0,1000,thread_read1000_cachekiller,
         thread_write1000_cachekiller,0);
    test("le 1 van der Corput",1,0,thread_le1,(thread_func_t)0x0,2);
    test("le 1000 van der Corput",0,1000,thread_le1000,(thread_func_t)0x0,2);
    for (lVar7 = 0; lVar7 != 8000; lVar7 = lVar7 + 8) {
      free(*(void **)((long)the1000p + lVar7));
    }
    uVar2 = (uint)any_bad;
  }
  return uVar2;
}

Assistant:

int main(int argc, char **argv)
{
    int opt;
    while ((opt = getopt(argc, argv, "a:")) != -1)
    {
        switch (opt)
        {
        case 'a':
            only_hm = atoi(optarg);
            break;
        default:
            exit(1);
        }
    }
    if (optind < argc)
        return fprintf(stderr, "%s: unknown arg '%s'\n", argv[0], argv[optind]), 1;

    randomize(0);
    for (int i=0; i<ARRAYSZ(the1000); i++)
        the1000[i] = rnd64();
    for (int i=0; i<ARRAYSZ(the1000p); i++)
        the1000p[i] = malloc(the1000[i]%65536+1);

    nthreads = nproc();
    if (!nthreads)
        nthreads = 8;
    nwthreads=nthreads/2;
    if (!nwthreads)
        nwthreads = 1;
    nrthreads=nthreads-nwthreads;
    if (!nrthreads)
        nrthreads = 1;
    printf("Using %zu threads; %zu readers %zu writers in mixed tests.\n",
        nthreads, nrthreads, nwthreads);
    test("read 1-of-1", 1, 0, thread_read1, 0, 0);
    test("read 1-of-2", 2, 0, thread_read1, 0, 0);
    test("read 1-of-1000", 1, 1000, thread_read1, 0, 0);
    test("read 1000-of-1000", 0, 1000, thread_read1000, 0, 0);
    test("read 1-of-1000 pointers", 0, -1000, thread_read1p, 0, 0);
#if __SIZEOF_SIZE_T__ == 8
    // These tests are slightly buggy: the 1000*nwthreads random values
    // must be unique, which I didn't bothered to check as the chance of
    // collision on 64-bit is negligible, esp. with CI being unreliable.
    // Enter 32-bit...
    // The library code is correct, just the tests are wrong.
    test("read 1 write 1000", 1, 0, thread_read1, thread_write1000, 0);
    test("read 1000 write 1000", 0, 1000, thread_read1000, thread_write1000, 0);
    test("read-write-remove", 0, 0, thread_read_write_remove, (thread_func_t)-1, 0);
#endif
    test("read 1-of-1 cachekiller", 1, 0, thread_read1_cachekiller, 0, 0);
    test("read 1-of-1000 cachekiller", 1, 1000, thread_read1_cachekiller, 0, 0);
#if __SIZEOF_SIZE_T__ == 8
    test("read 1000 write 1000 cachekiller", 0, 1000, thread_read1000_cachekiller, thread_write1000_cachekiller, 0);
#endif
    test("le 1 van der Corput", 1, 0, thread_le1, 0, 2);
    test("le 1000 van der Corput", 0, 1000, thread_le1000, 0, 2);

    for (int i=0; i<ARRAYSZ(the1000p); i++)
        free(the1000p[i]);
    return any_bad;
}